

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  EnumTypeSyntax *pEVar1;
  Token TVar2;
  DataTypeSyntax **unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_00000020;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  DataTypeSyntax *in_stack_ffffffffffffffa0;
  Token *args_4;
  
  TVar2 = parsing::Token::deepClone((Token *)in_stack_000000f0,in_stack_000000e8);
  args_4 = (Token *)TVar2.info;
  if (((Token *)((long)__fn + 0x20))->info != (Info *)0x0) {
    deepClone<slang::syntax::DataTypeSyntax>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  parsing::Token::deepClone((Token *)in_stack_000000f0,in_stack_000000e8);
  deepClone<slang::syntax::DeclaratorSyntax>(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone((Token *)in_stack_000000f0,in_stack_000000e8);
  deepClone<slang::syntax::VariableDimensionSyntax>(in_stack_00000050,in_stack_00000048);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::EnumTypeSyntax,slang::parsing::Token,slang::syntax::DataTypeSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)__child_stack,args_4,
                      in_stack_00000020);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const EnumTypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<EnumTypeSyntax>(
        node.keyword.deepClone(alloc),
        node.baseType ? deepClone(*node.baseType, alloc) : nullptr,
        node.openBrace.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.closeBrace.deepClone(alloc),
        *deepClone(node.dimensions, alloc)
    );
}